

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lottiemodel.h
# Opt level: O0

void __thiscall rlottie::internal::model::PathData::toPath(PathData *this,VPath *path)

{
  bool bVar1;
  VPointF *e;
  VPointF *this_00;
  VPointF *in_RSI;
  VPointF *in_RDI;
  VPath *unaff_retaddr;
  size_t i;
  VPointF *points;
  size_type size;
  size_t in_stack_ffffffffffffffc8;
  VPointF *in_stack_ffffffffffffffd8;
  VPointF *pVVar2;
  vector<VPointF,_std::allocator<VPointF>_> *in_stack_ffffffffffffffe0;
  VPointF *pVVar3;
  VPointF *c1;
  
  c1 = in_RDI;
  VPath::reset((VPath *)0x172e52);
  bVar1 = std::vector<VPointF,_std::allocator<VPointF>_>::empty(in_stack_ffffffffffffffe0);
  if (!bVar1) {
    e = (VPointF *)
        std::vector<VPointF,_std::allocator<VPointF>_>::size
                  ((vector<VPointF,_std::allocator<VPointF>_> *)in_RDI);
    this_00 = std::vector<VPointF,_std::allocator<VPointF>_>::data
                        ((vector<VPointF,_std::allocator<VPointF>_> *)0x172e80);
    VPath::reserve((VPath *)in_RDI,in_stack_ffffffffffffffc8,0x172eae);
    pVVar3 = this_00;
    VPath::moveTo((VPath *)this_00,in_stack_ffffffffffffffd8);
    for (pVVar2 = (VPointF *)0x1; pVVar2 < e; pVVar2 = (VPointF *)((long)&pVVar2->mx + 3)) {
      this_00 = pVVar3 + (long)pVVar2;
      VPath::cubicTo(unaff_retaddr,c1,in_RSI,e);
    }
    if (((ulong)(((_Vector_base<VPointF,_std::allocator<VPointF>_> *)&in_RDI[3].mx)->_M_impl).
                super__Vector_impl_data._M_start & 1) != 0) {
      VPath::close((VPath *)in_RSI,(int)this_00);
    }
  }
  return;
}

Assistant:

void toPath(VPath &path) const
    {
        path.reset();

        if (mPoints.empty()) return;

        auto size = mPoints.size();
        auto points = mPoints.data();
        /* reserve exact memory requirement at once
         * ptSize = size + 1(size + close)
         * elmSize = size/3 cubic + 1 move + 1 close
         */
        path.reserve(size + 1, size / 3 + 2);
        path.moveTo(points[0]);
        for (size_t i = 1; i < size; i += 3) {
            path.cubicTo(points[i], points[i + 1], points[i + 2]);
        }
        if (mClosed) path.close();
    }